

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void sprintf<int,int,char_const*>(stringstream *oss,string *fmt,int value,int args,char *args_1)

{
  ostream *this;
  ostream *poVar1;
  char cVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  char *__nptr;
  bool bVar7;
  char *pcVar8;
  byte bVar9;
  runtime_error *prVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [12];
  string local_68;
  int local_48;
  int local_44;
  char *local_40;
  char *local_38;
  
  local_48 = value;
  local_44 = args;
  if (fmt->_M_string_length != 0) {
    this = (ostream *)(oss + 0x10);
    uVar15 = 0;
    do {
      pcVar4 = (fmt->_M_dataplus)._M_p;
      cVar2 = pcVar4[uVar15];
      uVar13 = uVar15;
      if ((cVar2 == '%') && (uVar13 = uVar15 + 1, pcVar4[uVar15 + 1] != '%')) {
        local_38 = args_1;
        uVar15 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar13);
        if (uVar15 <= uVar13) {
          bVar7 = false;
          uVar14 = uVar13;
          goto LAB_00119036;
        }
        bVar7 = false;
        goto LAB_00118f63;
      }
      local_68._M_dataplus._M_p._0_1_ = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(this,(char *)&local_68,1);
      uVar15 = uVar13 + 1;
    } while (uVar15 < fmt->_M_string_length);
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"extra arguments provided to sprintf");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_00118f63:
  do {
    bVar9 = (fmt->_M_dataplus)._M_p[uVar13];
    uVar14 = uVar13;
    if (bVar9 < 0x2b) {
      if (bVar9 != 0x20) {
        if (bVar9 != 0x23) break;
        bVar7 = true;
      }
    }
    else if (bVar9 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar9 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar9 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar1 = this + *(long *)(*(long *)this + -0x18);
        if (oss[*(long *)(*(long *)this + -0x18) + 0xf1] == (stringstream)0x0) {
          std::ios::widen((char)poVar1);
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x30;
      }
    }
    uVar13 = uVar13 + 1;
    uVar14 = uVar15;
  } while (uVar15 != uVar13);
LAB_00119036:
  std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
  pcVar6 = (char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p);
  piVar11 = __errno_location();
  iVar3 = *piVar11;
  *piVar11 = 0;
  lVar12 = strtol(pcVar6,&local_40,10);
  pcVar8 = local_40;
  if (local_40 == pcVar6) {
    std::__throw_invalid_argument("stoi");
LAB_0011928d:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0011928d;
    if (*piVar11 == 0) {
      *piVar11 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
        &local_68.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                      local_68.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)this + -0x18) + 0x20) = lVar12;
    bVar9 = pcVar8[(long)((fmt->_M_dataplus)._M_p + (uVar14 - (long)pcVar6))];
    if (bVar9 != 0x2e) {
LAB_001191d1:
      pcVar6 = local_38;
      if ((bVar9 | 0x20) == 0x78) {
        lVar12 = *(long *)this;
        lVar5 = *(long *)(lVar12 + -0x18);
        *(uint *)(oss + lVar5 + 0x28) = *(uint *)(oss + lVar5 + 0x28) & 0xffffffb5 | 8;
        if (bVar7) {
          *(uint *)(oss + *(long *)(lVar12 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar12 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::operator<<(this,local_48);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
      sprintf<int,char_const*>(oss,&local_68,local_44,pcVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
          &local_68.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                        local_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
    __nptr = (char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p);
    piVar11 = __errno_location();
    iVar3 = *piVar11;
    *piVar11 = 0;
    lVar12 = strtol(__nptr,&local_40,10);
    if (local_40 != __nptr) {
      if ((0xfffffffeffffffff < lVar12 - 0x80000000U) && (*piVar11 != 0x22)) {
        if (*piVar11 == 0) {
          *piVar11 = iVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
            &local_68.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                          local_68.field_2._M_allocated_capacity + 1);
        }
        *(long *)(oss + *(long *)(*(long *)this + -0x18) + 0x18) = lVar12;
        bVar9 = local_40[(long)(pcVar8 + (long)((fmt->_M_dataplus)._M_p +
                                               (((uVar14 - (long)pcVar6) + 1) - (long)__nptr)))];
        goto LAB_001191d1;
      }
      goto LAB_001192a5;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001192a5:
  auVar16 = std::__throw_out_of_range("stoi");
  if (auVar16._8_4_ != 1) {
    _Unwind_Resume(auVar16._0_8_);
  }
  __cxa_begin_catch(auVar16._0_8_);
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar10,"Expected precision value in sprintf");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}